

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * ignore_attribute(dmr_C *C,token *token,symbol *attr,decl_state *ctx)

{
  expression *local_10;
  expression *expr;
  
  local_10 = (expression *)0x0;
  if ((((ulong)token->pos & 0x3f) == 0x11) && ((token->field_2).special == 0x28)) {
    token = dmrC_parens_expression(C,token,&local_10,"in attribute");
  }
  return token;
}

Assistant:

static struct token *ignore_attribute(struct dmr_C *C, struct token *token, struct symbol *attr, struct decl_state *ctx)
{
        (void) ctx;
        (void) attr;
	struct expression *expr = NULL;
	if (dmrC_match_op(token, '('))
		token = dmrC_parens_expression(C, token, &expr, "in attribute");
	return token;
}